

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

string * __thiscall
CLI::Formatter::make_option_opts_abi_cxx11_
          (string *__return_storage_ptr__,Formatter *this,Option *opt)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  reference ppOVar5;
  string local_4f8;
  Option *local_4d8;
  Option *op_1;
  iterator __end2_1;
  iterator __begin2_1;
  set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_> *__range2_1;
  string local_480;
  string local_460;
  set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_> local_440;
  string local_410;
  Option *local_3f0;
  Option *op;
  iterator __end2;
  iterator __begin2;
  set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_> *__range2;
  string local_398;
  string local_378;
  set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_> local_358;
  string local_328;
  allocator local_301;
  string local_300;
  string local_2e0;
  string local_2c0;
  allocator local_299;
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1c8;
  stringstream local_1a8 [8];
  stringstream out;
  ostream local_198 [376];
  Option *local_20;
  Option *opt_local;
  Formatter *this_local;
  
  local_20 = opt;
  opt_local = (Option *)this;
  this_local = (Formatter *)__return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1a8);
  iVar3 = Option::get_type_size(local_20);
  if (iVar3 != 0) {
    Option::get_type_name_abi_cxx11_(&local_1c8,local_20);
    bVar1 = ::std::__cxx11::string::empty();
    ::std::__cxx11::string::~string((string *)&local_1c8);
    if (((bVar1 ^ 0xff) & 1) != 0) {
      poVar4 = ::std::operator<<(local_198," ");
      Option::get_type_name_abi_cxx11_(&local_218,local_20);
      FormatterBase::get_label(&local_1f8,&this->super_FormatterBase,&local_218);
      ::std::operator<<(poVar4,(string *)&local_1f8);
      ::std::__cxx11::string::~string((string *)&local_1f8);
      ::std::__cxx11::string::~string((string *)&local_218);
    }
    Option::get_default_str_abi_cxx11_(&local_238,local_20);
    bVar1 = ::std::__cxx11::string::empty();
    ::std::__cxx11::string::~string((string *)&local_238);
    if (((bVar1 ^ 0xff) & 1) != 0) {
      poVar4 = ::std::operator<<(local_198,"=");
      Option::get_default_str_abi_cxx11_(&local_258,local_20);
      ::std::operator<<(poVar4,(string *)&local_258);
      ::std::__cxx11::string::~string((string *)&local_258);
    }
    iVar3 = Option::get_expected(local_20);
    if (1 < iVar3) {
      poVar4 = ::std::operator<<(local_198," x ");
      iVar3 = Option::get_expected(local_20);
      ::std::ostream::operator<<(poVar4,iVar3);
    }
    iVar3 = Option::get_expected(local_20);
    if (iVar3 == -1) {
      ::std::operator<<(local_198," ...");
    }
    bVar2 = OptionBase<CLI::Option>::get_required(&local_20->super_OptionBase<CLI::Option>);
    if (bVar2) {
      poVar4 = ::std::operator<<(local_198," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_298,"REQUIRED",&local_299);
      FormatterBase::get_label(&local_278,&this->super_FormatterBase,&local_298);
      ::std::operator<<(poVar4,(string *)&local_278);
      ::std::__cxx11::string::~string((string *)&local_278);
      ::std::__cxx11::string::~string((string *)&local_298);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_299);
    }
  }
  Option::get_envname_abi_cxx11_(&local_2c0,local_20);
  bVar1 = ::std::__cxx11::string::empty();
  ::std::__cxx11::string::~string((string *)&local_2c0);
  if (((bVar1 ^ 0xff) & 1) != 0) {
    poVar4 = ::std::operator<<(local_198," (");
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_300,"Env",&local_301);
    FormatterBase::get_label(&local_2e0,&this->super_FormatterBase,&local_300);
    poVar4 = ::std::operator<<(poVar4,(string *)&local_2e0);
    poVar4 = ::std::operator<<(poVar4,":");
    Option::get_envname_abi_cxx11_(&local_328,local_20);
    poVar4 = ::std::operator<<(poVar4,(string *)&local_328);
    ::std::operator<<(poVar4,")");
    ::std::__cxx11::string::~string((string *)&local_328);
    ::std::__cxx11::string::~string((string *)&local_2e0);
    ::std::__cxx11::string::~string((string *)&local_300);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_301);
  }
  Option::get_needs(&local_358,local_20);
  bVar2 = std::set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>::empty
                    (&local_358);
  std::set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>::~set
            (&local_358);
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    poVar4 = ::std::operator<<(local_198," ");
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_398,"Needs",(allocator *)((long)&__range2 + 7));
    FormatterBase::get_label(&local_378,&this->super_FormatterBase,&local_398);
    poVar4 = ::std::operator<<(poVar4,(string *)&local_378);
    ::std::operator<<(poVar4,":");
    ::std::__cxx11::string::~string((string *)&local_378);
    ::std::__cxx11::string::~string((string *)&local_398);
    ::std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 7));
    Option::get_needs((set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>
                       *)&__begin2,local_20);
    __end2 = std::set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>::
             begin((set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_> *)
                   &__begin2);
    op = (Option *)
         std::set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>::end
                   ((set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_> *)
                    &__begin2);
    while (bVar2 = std::operator!=(&__end2,(_Self *)&op), bVar2) {
      ppOVar5 = std::_Rb_tree_const_iterator<CLI::Option_*>::operator*(&__end2);
      local_3f0 = *ppOVar5;
      poVar4 = ::std::operator<<(local_198," ");
      Option::get_name_abi_cxx11_(&local_410,local_3f0,false,false);
      ::std::operator<<(poVar4,(string *)&local_410);
      ::std::__cxx11::string::~string((string *)&local_410);
      std::_Rb_tree_const_iterator<CLI::Option_*>::operator++(&__end2);
    }
    std::set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>::~set
              ((set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_> *)
               &__begin2);
  }
  Option::get_excludes(&local_440,local_20);
  bVar2 = std::set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>::empty
                    (&local_440);
  std::set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>::~set
            (&local_440);
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    poVar4 = ::std::operator<<(local_198," ");
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_480,"Excludes",(allocator *)((long)&__range2_1 + 7));
    FormatterBase::get_label(&local_460,&this->super_FormatterBase,&local_480);
    poVar4 = ::std::operator<<(poVar4,(string *)&local_460);
    ::std::operator<<(poVar4,":");
    ::std::__cxx11::string::~string((string *)&local_460);
    ::std::__cxx11::string::~string((string *)&local_480);
    ::std::allocator<char>::~allocator((allocator<char> *)((long)&__range2_1 + 7));
    Option::get_excludes
              ((set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_> *)
               &__begin2_1,local_20);
    __end2_1 = std::set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>::
               begin((set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_> *
                     )&__begin2_1);
    op_1 = (Option *)
           std::set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>::end
                     ((set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>
                       *)&__begin2_1);
    while (bVar2 = std::operator!=(&__end2_1,(_Self *)&op_1), bVar2) {
      ppOVar5 = std::_Rb_tree_const_iterator<CLI::Option_*>::operator*(&__end2_1);
      local_4d8 = *ppOVar5;
      poVar4 = ::std::operator<<(local_198," ");
      Option::get_name_abi_cxx11_(&local_4f8,local_4d8,false,false);
      ::std::operator<<(poVar4,(string *)&local_4f8);
      ::std::__cxx11::string::~string((string *)&local_4f8);
      std::_Rb_tree_const_iterator<CLI::Option_*>::operator++(&__end2_1);
    }
    std::set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>::~set
              ((set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_> *)
               &__begin2_1);
  }
  ::std::__cxx11::stringstream::str();
  ::std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

inline std::string Formatter::make_option_opts(const Option *opt) const {
    std::stringstream out;

    if(opt->get_type_size() != 0) {
        if(!opt->get_type_name().empty())
            out << " " << get_label(opt->get_type_name());
        if(!opt->get_default_str().empty())
            out << "=" << opt->get_default_str();
        if(opt->get_expected() > 1)
            out << " x " << opt->get_expected();
        if(opt->get_expected() == -1)
            out << " ...";
        if(opt->get_required())
            out << " " << get_label("REQUIRED");
    }
    if(!opt->get_envname().empty())
        out << " (" << get_label("Env") << ":" << opt->get_envname() << ")";
    if(!opt->get_needs().empty()) {
        out << " " << get_label("Needs") << ":";
        for(const Option *op : opt->get_needs())
            out << " " << op->get_name();
    }
    if(!opt->get_excludes().empty()) {
        out << " " << get_label("Excludes") << ":";
        for(const Option *op : opt->get_excludes())
            out << " " << op->get_name();
    }
    return out.str();
}